

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

string * __thiscall
spirv_cross::CompilerGLSL::to_composite_constructor_expression_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,SPIRType *parent_type,uint32_t id,
          bool block_like_type)

{
  bool bVar1;
  SPIRType *type;
  byte bVar2;
  char (*in_R9) [2];
  bool bVar3;
  spirv_cross local_1c0 [32];
  string local_1a0;
  SPIRType tmp_type;
  
  type = Compiler::expression_type(&this->super_Compiler,id);
  bVar3 = false;
  if ((parent_type->basetype == Struct) && (bVar3 = false, type->basetype == Boolean)) {
    bVar3 = (this->backend).boolean_in_struct_remapped_type != Boolean;
  }
  bVar1 = Compiler::is_array(&this->super_Compiler,type);
  if (bVar1) {
    bVar1 = (this->backend).array_is_value_type;
    bVar2 = (this->backend).array_is_value_type_in_buffer_blocks;
    if (!block_like_type) {
      bVar2 = bVar1;
    }
    if ((~(bVar1 & bVar2) & 1) != 0 || bVar3) {
      to_enclosed_expression_abi_cxx11_((string *)&tmp_type,this,id,true);
      to_rerolled_array_expression(__return_storage_ptr__,this,parent_type,(string *)&tmp_type,type)
      ;
      ::std::__cxx11::string::~string((string *)&tmp_type);
      return __return_storage_ptr__;
    }
  }
  to_unpacked_expression_abi_cxx11_(__return_storage_ptr__,this,id,true);
  if (bVar3) {
    SPIRType::SPIRType(&tmp_type,type);
    tmp_type.basetype = (this->backend).boolean_in_struct_remapped_type;
    (*(this->super_Compiler)._vptr_Compiler[0x13])(local_1c0,this,&tmp_type,0);
    join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
              (&local_1a0,local_1c0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x39e911,
               (char (*) [2])__return_storage_ptr__,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3a9fc7,in_R9);
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_1a0);
    ::std::__cxx11::string::~string((string *)&local_1a0);
    ::std::__cxx11::string::~string((string *)local_1c0);
    SPIRType::~SPIRType(&tmp_type);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::to_composite_constructor_expression(const SPIRType &parent_type, uint32_t id, bool block_like_type)
{
	auto &type = expression_type(id);

	bool reroll_array = false;
	bool remapped_boolean = parent_type.basetype == SPIRType::Struct &&
	                        type.basetype == SPIRType::Boolean &&
	                        backend.boolean_in_struct_remapped_type != SPIRType::Boolean;

	if (is_array(type))
	{
		reroll_array = !backend.array_is_value_type ||
		               (block_like_type && !backend.array_is_value_type_in_buffer_blocks);

		if (remapped_boolean)
		{
			// Forced to reroll if we have to change bool[] to short[].
			reroll_array = true;
		}
	}

	if (reroll_array)
	{
		// For this case, we need to "re-roll" an array initializer from a temporary.
		// We cannot simply pass the array directly, since it decays to a pointer and it cannot
		// participate in a struct initializer. E.g.
		// float arr[2] = { 1.0, 2.0 };
		// Foo foo = { arr }; must be transformed to
		// Foo foo = { { arr[0], arr[1] } };
		// The array sizes cannot be deduced from specialization constants since we cannot use any loops.

		// We're only triggering one read of the array expression, but this is fine since arrays have to be declared
		// as temporaries anyways.
		return to_rerolled_array_expression(parent_type, to_enclosed_expression(id), type);
	}
	else
	{
		auto expr = to_unpacked_expression(id);
		if (remapped_boolean)
		{
			auto tmp_type = type;
			tmp_type.basetype = backend.boolean_in_struct_remapped_type;
			expr = join(type_to_glsl(tmp_type), "(", expr, ")");
		}

		return expr;
	}
}